

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindProgramCommand.cxx
# Opt level: O2

bool __thiscall
cmFindProgramHelper::CheckDirectoryForName(cmFindProgramHelper *this,string *path,string *name)

{
  string *in_path;
  pointer pbVar1;
  bool bVar2;
  pointer pbVar3;
  string local_50;
  
  pbVar3 = (this->Extensions).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (this->Extensions).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  in_path = &this->TestNameExt;
  do {
    if (pbVar3 == pbVar1) {
LAB_0025f617:
      return pbVar3 != pbVar1;
    }
    if (pbVar3->_M_string_length == 0) {
LAB_0025f5b8:
      std::__cxx11::string::_M_assign((string *)in_path);
      std::__cxx11::string::append((string *)in_path);
      cmsys::SystemTools::CollapseFullPath(&local_50,in_path,path);
      std::__cxx11::string::operator=((string *)&this->TestPath,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      bVar2 = cmsys::SystemTools::FileExists(&this->TestPath,true);
      if (bVar2) {
        std::__cxx11::string::_M_assign((string *)&this->BestPath);
        goto LAB_0025f617;
      }
    }
    else {
      bVar2 = cmsys::SystemTools::StringEndsWith(name,(pbVar3->_M_dataplus)._M_p);
      if (!bVar2) goto LAB_0025f5b8;
    }
    pbVar3 = pbVar3 + 1;
  } while( true );
}

Assistant:

bool CheckDirectoryForName(std::string const& path, std::string const& name)
  {
    for (std::string const& ext : this->Extensions) {
      if (!ext.empty() && cmSystemTools::StringEndsWith(name, ext.c_str())) {
        continue;
      }
      this->TestNameExt = name;
      this->TestNameExt += ext;
      this->TestPath =
        cmSystemTools::CollapseFullPath(this->TestNameExt, path);

      if (cmSystemTools::FileExists(this->TestPath, true)) {
        this->BestPath = this->TestPath;
        return true;
      }
    }
    return false;
  }